

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_>::SetMemoryIndices
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_> *this,TPZVec<long> *indices)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = indices->fNElements;
  iVar3 = (int)uVar5;
  TPZManVector<long,_128>::Resize(&(this->fIntPtIndices).super_TPZManVector<long,_128>,(long)iVar3);
  plVar1 = indices->fStore;
  plVar2 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
  uVar4 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar3 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    plVar2[uVar4] = plVar1[uVar4];
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetMemoryIndices(TPZVec<int64_t> &indices) {
    int n = indices.size();
    fIntPtIndices.Resize(n);
    for (int i = 0; i < n; i++) {
        fIntPtIndices[i] = indices[i];
    }
}